

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darknet2ncnn.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *filename;
  char *filename_00;
  Section *pSVar1;
  pointer pbVar2;
  pointer pcVar3;
  pointer pfVar4;
  int merge_output;
  int iVar5;
  FILE *__s;
  FILE *pFVar6;
  _Map_pointer pppSVar7;
  undefined8 extraout_RAX;
  _Elt_pointer ppSVar8;
  long lVar9;
  ulong uVar10;
  char *__filename;
  _Elt_pointer ppSVar11;
  _Elt_pointer ppSVar12;
  char *__filename_00;
  pointer pbVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> b;
  deque<Section_*,_std::allocator<Section_*>_> dnet;
  _Map_pointer local_c8;
  _Elt_pointer local_c0;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  _Deque_base<Section_*,_std::allocator<Section_*>_> local_98;
  FILE *local_48;
  _Elt_pointer local_40;
  _Elt_pointer local_38;
  
  if (((uint)argc < 7) && ((0x68U >> (argc & 0x1fU) & 1) != 0)) {
    filename = argv[1];
    filename_00 = argv[2];
    merge_output = 1;
    if ((uint)argc < 5) {
      __filename_00 = "ncnn.param";
      __filename = "ncnn.bin";
    }
    else {
      __filename_00 = argv[3];
      __filename = argv[4];
      if (argc != 5) {
        merge_output = atoi(argv[5]);
      }
    }
    local_98._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_98._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_98._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_98._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_98._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_98._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_98._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_98._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_98._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_98._M_impl.super__Deque_impl_data._M_map_size = 0;
    std::_Deque_base<Section_*,_std::allocator<Section_*>_>::_M_initialize_map(&local_98,0);
    puts("Loading cfg...");
    load_cfg(filename,(deque<Section_*,_std::allocator<Section_*>_> *)&local_98);
    parse_cfg((deque<Section_*,_std::allocator<Section_*>_> *)&local_98,merge_output);
    puts("Loading weights...");
    load_weights(filename_00,(deque<Section_*,_std::allocator<Section_*>_> *)&local_98);
    __s = fopen(__filename_00,"wb");
    if (__s == (FILE *)0x0) {
      main_cold_2();
    }
    else {
      pFVar6 = fopen(__filename,"wb");
      if (pFVar6 != (FILE *)0x0) {
        puts("Converting model...");
        fwrite("7767517\n",8,1,__s);
        uVar10 = 0;
        ppSVar11 = local_98._M_impl.super__Deque_impl_data._M_start._M_cur;
        ppSVar8 = local_98._M_impl.super__Deque_impl_data._M_start._M_last;
        pppSVar7 = local_98._M_impl.super__Deque_impl_data._M_start._M_node;
        while (ppSVar11 != local_98._M_impl.super__Deque_impl_data._M_finish._M_cur) {
          ppSVar12 = ppSVar11 + 1;
          if (ppSVar12 == ppSVar8) {
            ppSVar12 = pppSVar7[1];
            pppSVar7 = pppSVar7 + 1;
            ppSVar8 = ppSVar12 + 0x40;
          }
          uVar10 = (ulong)(uint)((int)uVar10 +
                                (int)((ulong)((long)((*ppSVar11)->output_blobs).
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)((*ppSVar11)->output_blobs).
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 5));
          ppSVar11 = ppSVar12;
        }
        fprintf(__s,"%d %d\n",
                (ulong)((int)((ulong)((long)local_98._M_impl.super__Deque_impl_data._M_start._M_last
                                     - (long)local_98._M_impl.super__Deque_impl_data._M_start._M_cur
                                     ) >> 3) +
                        (int)((ulong)((long)local_98._M_impl.super__Deque_impl_data._M_finish._M_cur
                                     - (long)local_98._M_impl.super__Deque_impl_data._M_finish.
                                             _M_first) >> 3) +
                       ((((uint)((int)local_98._M_impl.super__Deque_impl_data._M_finish._M_node -
                                (int)local_98._M_impl.super__Deque_impl_data._M_start._M_node) >> 3)
                        - 1) + (uint)(local_98._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                     (_Map_pointer)0x0)) * 0x40),uVar10);
        local_40 = local_98._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_98._M_impl.super__Deque_impl_data._M_start._M_cur !=
            local_98._M_impl.super__Deque_impl_data._M_finish._M_cur) {
          local_c0 = local_98._M_impl.super__Deque_impl_data._M_start._M_last;
          local_c8 = local_98._M_impl.super__Deque_impl_data._M_start._M_node;
          ppSVar8 = local_98._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_48 = pFVar6;
          do {
            pSVar1 = *ppSVar8;
            local_38 = ppSVar8;
            fprintf(__s,"%-22s %-20s %d %d",(pSVar1->layer_type)._M_dataplus._M_p,
                    (pSVar1->layer_name)._M_dataplus._M_p,
                    (ulong)((long)(pSVar1->input_blobs).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pSVar1->input_blobs).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5,
                    (ulong)((long)(pSVar1->output_blobs).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pSVar1->output_blobs).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5);
            pbVar2 = (pSVar1->input_blobs).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar13 = (pSVar1->input_blobs).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar2;
                pbVar13 = pbVar13 + 1) {
              pcVar3 = (pbVar13->_M_dataplus)._M_p;
              local_b8[0] = local_a8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_b8,pcVar3,pcVar3 + pbVar13->_M_string_length);
              fprintf(__s," %s",local_b8[0]);
              if (local_b8[0] != local_a8) {
                operator_delete(local_b8[0]);
              }
            }
            pbVar2 = (pSVar1->output_blobs).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar13 = (pSVar1->output_blobs).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar2;
                pbVar13 = pbVar13 + 1) {
              pcVar3 = (pbVar13->_M_dataplus)._M_p;
              local_b8[0] = local_a8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_b8,pcVar3,pcVar3 + pbVar13->_M_string_length);
              fprintf(__s," %s",local_b8[0]);
              if (local_b8[0] != local_a8) {
                operator_delete(local_b8[0]);
              }
            }
            pbVar2 = (pSVar1->param).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar13 = (pSVar1->param).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar2;
                pbVar13 = pbVar13 + 1) {
              pcVar3 = (pbVar13->_M_dataplus)._M_p;
              local_b8[0] = local_a8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_b8,pcVar3,pcVar3 + pbVar13->_M_string_length);
              fprintf(__s," %s",local_b8[0]);
              if (local_b8[0] != local_a8) {
                operator_delete(local_b8[0]);
              }
            }
            fputc(10,__s);
            iVar5 = std::__cxx11::string::compare((char *)pSVar1);
            pFVar6 = local_48;
            if (iVar5 == 0) {
              fseek(local_48,4,1);
              pfVar4 = (pSVar1->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar9 = (long)(pSVar1->weights).super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pfVar4;
              if (lVar9 != 0) {
                fwrite(pfVar4,4,lVar9 >> 2,pFVar6);
              }
              pfVar4 = (pSVar1->scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar9 = (long)(pSVar1->scales).super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pfVar4;
              if (lVar9 != 0) {
                fwrite(pfVar4,4,lVar9 >> 2,pFVar6);
              }
              pfVar4 = (pSVar1->rolling_mean).super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              lVar9 = (long)(pSVar1->rolling_mean).super__Vector_base<float,_std::allocator<float>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar4;
              if (lVar9 != 0) {
                fwrite(pfVar4,4,lVar9 >> 2,pFVar6);
              }
              pfVar4 = (pSVar1->rolling_variance).super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              lVar9 = (long)(pSVar1->rolling_variance).
                            super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pfVar4;
              if (lVar9 != 0) {
                fwrite(pfVar4,4,lVar9 >> 2,pFVar6);
              }
              pfVar4 = (pSVar1->bias).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar9 = (long)(pSVar1->bias).super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_finish - (long)pfVar4;
              if (lVar9 != 0) {
                fwrite(pfVar4,4,lVar9 >> 2,pFVar6);
              }
            }
            ppSVar8 = local_38 + 1;
            if (ppSVar8 == local_c0) {
              ppSVar8 = local_c8[1];
              local_c8 = local_c8 + 1;
              local_c0 = ppSVar8 + 0x40;
            }
          } while (ppSVar8 != local_40);
        }
        fclose(__s);
        uVar10 = 0;
        if (local_98._M_impl.super__Deque_impl_data._M_start._M_cur !=
            local_98._M_impl.super__Deque_impl_data._M_finish._M_cur) {
          uVar10 = 0;
          pppSVar7 = local_98._M_impl.super__Deque_impl_data._M_start._M_node;
          ppSVar11 = local_98._M_impl.super__Deque_impl_data._M_start._M_cur;
          ppSVar8 = local_98._M_impl.super__Deque_impl_data._M_start._M_last;
          do {
            ppSVar12 = ppSVar11 + 1;
            if (ppSVar12 == ppSVar8) {
              ppSVar12 = pppSVar7[1];
              pppSVar7 = pppSVar7 + 1;
              ppSVar8 = ppSVar12 + 0x40;
            }
            uVar10 = (ulong)(uint)((int)uVar10 +
                                  (int)((ulong)((long)((*ppSVar11)->output_blobs).
                                                                                                            
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)((*ppSVar11)->output_blobs).
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 5));
            ppSVar11 = ppSVar12;
          } while (ppSVar12 != local_98._M_impl.super__Deque_impl_data._M_finish._M_cur);
        }
        printf("%d layers, %d blobs generated.\n",
               (ulong)((int)((ulong)((long)local_98._M_impl.super__Deque_impl_data._M_start._M_last
                                    - (long)local_98._M_impl.super__Deque_impl_data._M_start._M_cur)
                            >> 3) +
                       (int)((ulong)((long)local_98._M_impl.super__Deque_impl_data._M_finish._M_cur
                                    - (long)local_98._M_impl.super__Deque_impl_data._M_finish.
                                            _M_first) >> 3) +
                      ((((uint)((int)local_98._M_impl.super__Deque_impl_data._M_finish._M_node -
                               (int)local_98._M_impl.super__Deque_impl_data._M_start._M_node) >> 3)
                       - 1) + (uint)(local_98._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                    (_Map_pointer)0x0)) * 0x40),uVar10);
        puts("NOTE: The input of darknet uses: mean_vals=0 and norm_vals=1/255.f.");
        if (merge_output == 0) {
          printf("NOTE: There are %d unmerged yolo output layer. Make sure all outputs are processed with nms.\n"
                 ,(ulong)(uint)yolo_layer_count);
        }
        if (letter_box_enabled == true) {
          puts("NOTE: Make sure your pre-processing and post-processing support letter_box.");
        }
        puts("NOTE: Remember to use ncnnoptimize for better performance.");
        std::_Deque_base<Section_*,_std::allocator<Section_*>_>::~_Deque_base(&local_98);
        return 0;
      }
    }
    main_cold_1();
    std::_Deque_base<Section_*,_std::allocator<Section_*>_>::~_Deque_base(&local_98);
    _Unwind_Resume(extraout_RAX);
  }
  main_cold_3();
  return -1;
}

Assistant:

int main(int argc, char** argv)
{
    if (!(argc == 3 || argc == 5 || argc == 6))
    {
        fprintf(stderr, "Usage: %s [darknetcfg] [darknetweights] [ncnnparam] [ncnnbin] [merge_output]\n"
                "\t[darknetcfg]     .cfg file of input darknet model.\n"
                "\t[darknetweights] .weights file of input darknet model.\n"
                "\t[cnnparam]       .param file of output ncnn model.\n"
                "\t[ncnnbin]        .bin file of output ncnn model.\n"
                "\t[merge_output]   merge all output yolo layers into one, enabled by default.\n",
                argv[0]);
        return -1;
    }

    const char* darknetcfg = argv[1];
    const char* darknetweights = argv[2];
    const char* ncnn_param = argc >= 5 ? argv[3] : "ncnn.param";
    const char* ncnn_bin = argc >= 5 ? argv[4] : "ncnn.bin";
    int merge_output = argc >= 6 ? atoi(argv[5]) : 1;

    std::deque<Section*> dnet;

    printf("Loading cfg...\n");
    load_cfg(darknetcfg, dnet);
    parse_cfg(dnet, merge_output);

    printf("Loading weights...\n");
    load_weights(darknetweights, dnet);

    FILE* pp = fopen(ncnn_param, "wb");
    if (pp == NULL)
        file_error(ncnn_param);

    FILE* bp = fopen(ncnn_bin, "wb");
    if (bp == NULL)
        file_error(ncnn_bin);

    printf("Converting model...\n");

    fprintf(pp, "7767517\n");
    fprintf(pp, "%d %d\n", (int)dnet.size(), count_output_blob(dnet));

    for (auto s : dnet)
    {
        fprintf(pp, "%-22s %-20s %d %d", s->layer_type.c_str(), s->layer_name.c_str(), (int)s->input_blobs.size(), (int)s->output_blobs.size());
        for (auto b : s->input_blobs)
            fprintf(pp, " %s", b.c_str());
        for (auto b : s->output_blobs)
            fprintf(pp, " %s", b.c_str());
        for (auto p : s->param)
            fprintf(pp, " %s", p.c_str());
        fprintf(pp, "\n");

        if (s->name == "convolutional")
        {
            fseek(bp, 4, SEEK_CUR);
            if (s->weights.size() > 0)
                fwrite(&s->weights[0], sizeof(float), s->weights.size(), bp);
            if (s->scales.size() > 0)
                fwrite(&s->scales[0], sizeof(float), s->scales.size(), bp);
            if (s->rolling_mean.size() > 0)
                fwrite(&s->rolling_mean[0], sizeof(float), s->rolling_mean.size(), bp);
            if (s->rolling_variance.size() > 0)
                fwrite(&s->rolling_variance[0], sizeof(float), s->rolling_variance.size(), bp);
            if (s->bias.size() > 0)
                fwrite(&s->bias[0], sizeof(float), s->bias.size(), bp);
        }
    }
    fclose(pp);

    printf("%d layers, %d blobs generated.\n", (int)dnet.size(), count_output_blob(dnet));
    printf("NOTE: The input of darknet uses: mean_vals=0 and norm_vals=1/255.f.\n");
    if (!merge_output)
        printf("NOTE: There are %d unmerged yolo output layer. Make sure all outputs are processed with nms.\n", yolo_layer_count);
    if (letter_box_enabled)
        printf("NOTE: Make sure your pre-processing and post-processing support letter_box.\n");
    printf("NOTE: Remember to use ncnnoptimize for better performance.\n");

    return 0;
}